

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O2

void grasshopper_decrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  ulong uVar1;
  grasshopper_w128_t *y;
  
  grasshopper_copy128(target,source);
  grasshopper_append128multi(buffer,target,grasshopper_l_dec128);
  y = subkeys->k + 9;
  for (uVar1 = 9; 1 < uVar1; uVar1 = uVar1 - 1) {
    grasshopper_append128(target,y);
    grasshopper_append128multi(buffer,target,grasshopper_pil_dec128);
    y = y + -1;
  }
  grasshopper_append128(target,subkeys->k + 1);
  grasshopper_convert128(target,grasshopper_pi_inv);
  grasshopper_append128(target,subkeys->k);
  return;
}

Assistant:

void grasshopper_decrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    grasshopper_append128multi(buffer, target, grasshopper_l_dec128);

    for (i = 9; i > 1; i--) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_dec128);
    }

    grasshopper_append128(target, &subkeys->k[1]);
    grasshopper_convert128(target, grasshopper_pi_inv);
    grasshopper_append128(target, &subkeys->k[0]);
}